

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O3

REF_STATUS
ref_phys_convdiff(REF_DBL *state,REF_DBL *grad,REF_DBL diffusivity,REF_DBL *dir,REF_DBL *flux)

{
  double dVar1;
  
  dVar1 = (*dir + dir[1] + dir[2]) * *state;
  *flux = dVar1;
  *flux = dVar1 - (dir[2] * grad[2] + *dir * *grad + dir[1] * grad[1]) * diffusivity;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_phys_convdiff(REF_DBL *state, REF_DBL *grad,
                                     REF_DBL diffusivity, REF_DBL *dir,
                                     REF_DBL *flux) {
  REF_DBL velocity[3];

  velocity[0] = 1.0;
  velocity[1] = 1.0;
  velocity[2] = 1.0;

  flux[0] = ref_math_dot(dir, velocity) * state[0];

  flux[0] -= diffusivity * ref_math_dot(dir, grad);

  return REF_SUCCESS;
}